

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeFunctionConstructor
               (DynamicObject *functionConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  PropertyString *pPVar1;
  RuntimeFunction *pRVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,functionConstructor,mode,3,0);
  this = (((functionConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(functionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (functionConstructor,0x124,(this->super_JavascriptLibraryBase).functionPrototype.ptr,0,0
             ,0,0);
  (*(functionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (functionConstructor,0xd1,&DAT_1000000000001,2,0,0,0);
  pPVar1 = ScriptContext::GetPropertyString(this_00,0x9b);
  (*(functionConstructor->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (functionConstructor,0x106,pPVar1,2,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(functionConstructor,true);
  if (DAT_015991f3 == '\x01') {
    pRVar2 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptFunction::EntryInfo::InvokeJit,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0xbc);
    (*(functionConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (functionConstructor,0xbc,pRVar2,6,0,0,0);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunctionConstructor(DynamicObject* functionConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(functionConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterFunction
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = functionConstructor->GetScriptContext();
        JavascriptLibrary* library = functionConstructor->GetLibrary();
        library->AddMember(functionConstructor, PropertyIds::prototype, library->functionPrototype, PropertyNone);
        library->AddMember(functionConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(functionConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Function), PropertyConfigurable);

        functionConstructor->SetHasNoEnumerableProperties(true);

#ifdef ALLOW_JIT_REPRO
        if (CONFIG_FLAG(JitRepro))
        {
            library->AddFunctionToLibraryObject(functionConstructor, PropertyIds::invokeJit, &JavascriptFunction::EntryInfo::InvokeJit, 1);
        }
#endif

        return true;
    }